

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall
MPLSStreamInfo::composeStreamAttributes(MPLSStreamInfo *this,BitStreamWriter *writer)

{
  uint uVar1;
  uint uVar2;
  StreamType stream_coding_type;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  bool bVar8;
  undefined4 *puVar9;
  uint uVar10;
  uint value;
  int local_1e0;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream ss;
  
  puVar4 = (writer->super_BitStream).m_buffer;
  puVar5 = (writer->super_BitStream).m_initBuffer;
  uVar1 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,0);
  puVar6 = (writer->super_BitStream).m_buffer;
  puVar7 = (writer->super_BitStream).m_initBuffer;
  uVar2 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,(this->super_M2TSStreamInfo).stream_coding_type);
  stream_coding_type = (this->super_M2TSStreamInfo).stream_coding_type;
  bVar8 = isVideoStreamType(stream_coding_type);
  if (bVar8) {
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).video_format);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).frame_rate_index);
    uVar3 = (this->super_M2TSStreamInfo).HDR;
    uVar10 = 0x22;
    if (uVar3 != 4) {
      uVar10 = 0;
    }
    value = 0x12;
    if ((uVar3 & 0x12) == 0) {
      value = uVar10;
    }
    BitStreamWriter::putBits(writer,8,value);
    BitStreamWriter::putBits(writer,8,(uint)((this->super_M2TSStreamInfo).HDR == 0x10) << 6);
  }
  else {
    bVar8 = isAudioStreamType(stream_coding_type);
    if (bVar8) {
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).audio_presentation_type);
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).sampling_frequency_index)
      ;
      CLPIStreamInfo::writeString((this->super_M2TSStreamInfo).language_code,writer,3);
      goto LAB_001e9d01;
    }
    if (stream_coding_type != SUB_PGS) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::operator<<((ostream *)&ss,"Unsupported media type for AVCHD/Blu-ray muxing");
      puVar9 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar9 = 3;
      *(undefined4 **)(puVar9 + 2) = puVar9 + 6;
      if (local_1c8 == &local_1b8) {
        puVar9[6] = local_1b8;
        puVar9[7] = uStack_1b4;
        puVar9[8] = uStack_1b0;
        puVar9[9] = uStack_1ac;
      }
      else {
        *(uint **)(puVar9 + 2) = local_1c8;
        *(ulong *)(puVar9 + 6) = CONCAT44(uStack_1b4,local_1b8);
      }
      *(undefined8 *)(puVar9 + 4) = local_1c0;
      local_1b8 = local_1b8 & 0xffffff00;
      __cxa_throw(puVar9,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    CLPIStreamInfo::writeString((this->super_M2TSStreamInfo).language_code,writer,3);
  }
  BitStreamWriter::putBits(writer,8,0);
LAB_001e9d01:
  local_1e0 = (int)puVar7;
  *(char *)((long)puVar5 + (long)((int)(uVar1 + ((int)puVar4 - (int)puVar5) * 8) / 8)) =
       (char)((int)((*(int *)&(writer->super_BitStream).m_buffer -
                    *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited) / 8)
       + (char)((int)(uVar2 + ((int)puVar6 - local_1e0) * 8) / -8);
  return;
}

Assistant:

void MPLSStreamInfo::composeStreamAttributes(BitStreamWriter& writer)
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const int initPos = writer.getBitsCount() / 8;

    writer.putBits(8, static_cast<int>(stream_coding_type));
    if (isVideoStreamType(stream_coding_type))
    {
        writer.putBits(4, video_format);
        writer.putBits(4, frame_rate_index);
        if (HDR & 18)
            writer.putBits(8, 0x12);  // HDR10 or HDR10plus
        else if (HDR == 4)
            writer.putBits(8, 0x22);  // DV
        else
            writer.putBits(8, 0);
        if (HDR == 16)
            writer.putBits(8, 0x40);  // HDR10plus
        else
            writer.putBits(8, 0);
        writer.putBits(8, 0);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        writer.putBits(4, audio_presentation_type);
        writer.putBits(4, sampling_frequency_index);
        CLPIStreamInfo::writeString(language_code, writer, 3);
    }
    else if (stream_coding_type == StreamType::SUB_PGS)
    {
        // Presentation Graphics stream
        CLPIStreamInfo::writeString(language_code, writer, 3);
        writer.putBits(8, 0);  // reserved_for_future_use
    }
    else
        THROW(ERR_COMMON, "Unsupported media type for AVCHD/Blu-ray muxing")
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - initPos);
}